

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_cover.cc
# Opt level: O2

float query_decision(active_cover *a,single_learner *l,example *ec,float prediction,float pmin,
                    bool in_dis)

{
  bool bVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  bVar1 = 3.0 < (double)ec->weight + a->all->sd->t;
  if (in_dis && bVar1) {
    if (a->oracular == false) {
      fVar4 = pmin * 4.0 * pmin;
      fVar3 = *(float *)(&DAT_00233510 + (ulong)(0.0 < prediction) * 4);
      uVar2 = 0;
      while (uVar2 < a->cover_size) {
        LEARNER::learner<char,_example>::predict(l,ec,uVar2 + 1);
        fVar4 = fVar4 + (a->lambda_n[uVar2] / a->lambda_d[uVar2]) *
                        (float)(-(uint)(*(float *)(&DAT_00233510 +
                                                  (ulong)(0.0 < (ec->pred).scalar) * 4) != fVar3) &
                               0x3f800000);
        uVar2 = uVar2 + 1;
      }
      fVar5 = SQRT(fVar4);
      fVar3 = fVar5;
      if (fVar4 < 0.0) {
        fVar3 = sqrtf(fVar4);
        fVar5 = sqrtf(fVar4);
      }
      fVar3 = fVar3 / (fVar5 + 1.0);
      fVar4 = 1.0;
      if ((~(uint)fVar3 & 0x7fc00000) != 0) {
        fVar4 = fVar3;
      }
      fVar3 = merand48(&a->all->random_state);
      fVar3 = (float)(-(uint)(fVar4 < fVar3) & 0xbf800000 |
                     ~-(uint)(fVar4 < fVar3) & (uint)(1.0 / fVar4));
    }
    else {
      fVar3 = 1.0;
    }
  }
  else {
    fVar3 = *(float *)(&DAT_00238800 + (ulong)bVar1 * 4);
  }
  return fVar3;
}

Assistant:

float query_decision(active_cover& a, single_learner& l, example& ec, float prediction, float pmin, bool in_dis)
{
  if (a.all->sd->t + ec.weight <= 3)
  {
    return 1.f;
  }

  if (!in_dis)
  {
    return -1.f;
  }

  if (a.oracular)
  {
    return 1.f;
  }

  float p, q2 = 4.f * pmin * pmin;

  for (size_t i = 0; i < a.cover_size; i++)
  {
    l.predict(ec, i + 1);
    q2 += ((float)(sign(ec.pred.scalar) != sign(prediction))) * (a.lambda_n[i] / a.lambda_d[i]);
  }

  p = sqrt(q2) / (1 + sqrt(q2));

  if (nanpattern(p))
  {
    p = 1.f;
  }

  if (merand48(a.all->random_state) <= p)
  {
    return 1.f / p;
  }
  else
  {
    return -1.f;
  }
}